

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadString(ON_BinaryArchive *this,ON_wString *s)

{
  bool bVar1;
  uint sUTF32_count;
  uint uVar2;
  wchar_t *sUTF32;
  int iVar3;
  uint error_status;
  ON_SimpleArray<unsigned_short> utf16_buffer;
  size_t string_utf16_element_count;
  uint local_4c;
  ON_SimpleArray<unsigned_short> local_48;
  size_t local_30;
  
  ON_wString::Destroy(s);
  local_30 = 0;
  bVar1 = ReadStringUTF16ElementCount(this,&local_30);
  if (local_30 == 0 || !bVar1) {
    return bVar1;
  }
  iVar3 = (int)local_30;
  ON_SimpleArray<unsigned_short>::ON_SimpleArray(&local_48,(long)iVar3);
  bVar1 = ReadInt16(this,local_30,(ON__INT16 *)local_48.m_a);
  if (bVar1) {
    if ((-1 < iVar3) && (iVar3 <= local_48.m_capacity)) {
      local_48.m_count = iVar3;
    }
    local_48.m_a[(long)iVar3 - 1] = 0;
    local_4c = 0;
    sUTF32_count = ON_ConvertUTF16ToUTF32
                             (0,local_48.m_a,iVar3 + -1,(uint *)0x0,0,&local_4c,0xffffffff,0xfffd,
                              (ON__UINT16 **)0x0);
    if (sUTF32_count == 0) {
LAB_003c5609:
      ON_SimpleArray<unsigned_short>::~ON_SimpleArray(&local_48);
      return true;
    }
    if (0 < (int)sUTF32_count) {
      local_4c = 0;
      ON_wString::ReserveArray(s,(ulong)(sUTF32_count + 1));
      sUTF32 = ON_wString::Array(s);
      uVar2 = ON_ConvertUTF16ToUTF32
                        (0,local_48.m_a,iVar3 + -1,(uint *)sUTF32,sUTF32_count,&local_4c,0xffffffff,
                         0xfffd,(ON__UINT16 **)0x0);
      if (uVar2 == sUTF32_count) {
        ON_wString::SetLength(s,(ulong)sUTF32_count);
        goto LAB_003c5609;
      }
    }
  }
  ON_SimpleArray<unsigned_short>::~ON_SimpleArray(&local_48);
  ON_wString::Destroy(s);
  return false;
}

Assistant:

bool
ON_BinaryArchive::ReadString( ON_wString& s )
{
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
// Disable the MSC /W4 "conditional expression is constant" warning
// about 2 == sizeof(wchar_t).  Since this code has to run on machines
// where sizeof(wchar_t) can be 2, 4, or 8 bytes, the test is necessary.
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  s.Destroy();
  size_t string_utf16_element_count = 0;
  bool rc = ReadStringUTF16ElementCount( &string_utf16_element_count );
  if ( rc && string_utf16_element_count > 0 ) 
  {
    // string_utf16_element_count = number of ON__INT16 elements in
    // the string.  This is almost always the same as the
    // number of unicode code points. However, if one of
    // the code points happens to require two ON__INT16 
    // values to encode, then string_utf16_element_count will be 
    // larger than the number of unicode code points in 
    // the array.
    const int istring_utf16_element_count = (int)string_utf16_element_count;
    if ( 2 == sizeof(wchar_t) ) 
    {
      // When sizeof(wchar_t) is 2 bytes, assume wchar_t strings are 
      // UTF-16 encoded unicode strings.
      s.ReserveArray( istring_utf16_element_count );
      rc = ReadInt16( string_utf16_element_count, (ON__INT16*)s.Array() );
      if (rc)
        s.SetLength( istring_utf16_element_count-1 );
    }
    else if ( 4 == sizeof(wchar_t)  )
    {
      // When sizeof(wchar_t) is 4 bytes, assume wchar_t strings are 
      // UTF-32 encoded unicode strings. (some Apple CLang and GNU gcc implementations do this.)

      // Read the UTF-16 encode string from the file into
      // utf16_buffer[].
      ON_SimpleArray<ON__UINT16> utf16_buffer(istring_utf16_element_count);
      rc = ReadInt16(string_utf16_element_count,(ON__INT16*)utf16_buffer.Array());
      if(rc)
      {
        // convert to a UTF-32 encoded unicode string.
        utf16_buffer.SetCount(istring_utf16_element_count);
        utf16_buffer[istring_utf16_element_count-1] = 0;
        rc = false;
        const ON__UINT16* sUTF16 = utf16_buffer.Array();
        const int bTestByteOrder = false;
        const int sUTF16_count = istring_utf16_element_count-1;
        const ON__UINT32 error_code_point = 0xFFFD;
        const unsigned int error_mask = 0xFFFFFFFF;
        unsigned int error_status = 0;

        const int utf32_array_count = ON_ConvertUTF16ToUTF32(
            bTestByteOrder,
            sUTF16,
            sUTF16_count,
            0, // unsigned int* sUTF32
            0, // int sUTF32_count
            &error_status,
            error_mask,
            error_code_point,
            0 // const ON__UINT16** sNextUTF16
            );

        if ( 0 == utf32_array_count )
        {
          rc = true;
        }
        else if ( utf32_array_count > 0 )
        {
          error_status = 0;
          s.ReserveArray(utf32_array_count+1);
          const int utf32_array_count1 = ON_ConvertUTF16ToUTF32(
              bTestByteOrder,
              sUTF16,
              sUTF16_count,
              (unsigned int*)s.Array(), // unsigned int* sUTF32
              utf32_array_count, // sUTF32_count
              &error_status,
              error_mask,
              error_code_point,
              0 // const ON__UINT16** sNextUTF16
              );
          if ( utf32_array_count1 == utf32_array_count )
          {
            s.SetLength( utf32_array_count );
            rc = true;
          }
        }
      }
    }
    if (!rc)
      s.Destroy();
  }
  return rc;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif
}